

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O3

int Sbd_ManCollectConstantsNew
              (sat_solver *pSat,Vec_Int_t *vDivVars,int nConsts,int PivotVar,word *pOnset,
              word *pOffset)

{
  ulong *puVar1;
  uint uVar2;
  word *pwVar3;
  int *piVar4;
  int iVar5;
  undefined4 in_register_0000000c;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  word **ppwVar9;
  ulong uVar10;
  uint uVar11;
  int iLit;
  uint local_70;
  int local_6c;
  uint local_68;
  uint local_64;
  ulong local_60;
  word *local_58 [2];
  ulong local_48;
  undefined8 local_40;
  word *local_38;
  
  local_40 = CONCAT44(in_register_0000000c,PivotVar);
  local_58[0] = pOnset;
  local_38 = pOffset;
  if (0x3f < vDivVars->nSize) {
    __assert_fail("Vec_IntSize(vDivVars) < 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                  ,0x1b6,
                  "int Sbd_ManCollectConstantsNew(sat_solver *, Vec_Int_t *, int, int, word *, word *)"
                 );
  }
  local_68 = PivotVar * 2;
  local_48 = (ulong)(uint)nConsts;
  ppwVar9 = local_58;
  uVar7 = CONCAT71((int7)((ulong)local_40 >> 8),1);
  local_60 = 0;
  local_6c = nConsts;
  do {
    local_64 = (uint)uVar7;
    if (0 < local_6c) {
      uVar10 = local_60 ^ 1;
      uVar11 = local_68 | (uint)local_60;
      uVar8 = 0;
      do {
        sat_solver_random_polarity(pSat);
        if ((int)local_40 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        local_70 = uVar11;
        iVar5 = sat_solver_solve(pSat,(lit *)&local_70,&local_6c,0,0,0,0);
        if (iVar5 == -1) {
          return (int)local_60;
        }
        if (iVar5 == 0) {
          return -2;
        }
        uVar2 = vDivVars->nSize;
        pwVar3 = *ppwVar9;
        pwVar3[uVar8] = uVar10 << ((byte)uVar2 & 0x3f);
        if (0 < (int)uVar2) {
          piVar4 = vDivVars->pArray;
          uVar6 = 0;
          do {
            iVar5 = piVar4[uVar6];
            if (((long)iVar5 < 0) || (pSat->size <= iVar5)) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                            ,0xda,"int sat_solver_var_value(sat_solver *, int)");
            }
            if (pSat->model[iVar5] == 1) {
              puVar1 = pwVar3 + uVar8 + (uVar6 >> 6 & 0x3ffffff);
              *puVar1 = *puVar1 ^ 1L << ((byte)uVar6 & 0x3f);
            }
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != local_48);
    }
    local_60 = 1;
    ppwVar9 = &local_38;
    uVar7 = 0;
    if ((local_64 & 1) == 0) {
      return -1;
    }
  } while( true );
}

Assistant:

int Sbd_ManCollectConstantsNew( sat_solver * pSat, Vec_Int_t * vDivVars, int nConsts, int PivotVar, word * pOnset, word * pOffset )
{
    int nBTLimit = 0;
    int n, i, k, status, iLit, iVar; 
    word * pPats[2] = {pOnset, pOffset};
    assert( Vec_IntSize(vDivVars) < 64 );
    for ( n = 0; n < 2; n++ )
    for ( i = 0; i < nConsts; i++ )
    {
        sat_solver_random_polarity( pSat );
        iLit = Abc_Var2Lit( PivotVar, n );
        status = sat_solver_solve( pSat, &iLit, &iLit + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return -2;
        if ( status == l_False )
            return n;
        pPats[n][i] = ((word)!n) << Vec_IntSize(vDivVars);
        Vec_IntForEachEntry( vDivVars, iVar, k )
            if ( sat_solver_var_value(pSat, iVar) )
                Abc_TtXorBit(&pPats[n][i], k);
    }
    return -1;
}